

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O0

zg_t * tchecker::zg::factory
                 (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                 semantics_type_t semantics_type,extrapolation_type_t extrapolation_type,
                 size_t block_size,size_t table_size)

{
  element_type *system_00;
  extrapolation_t *__p;
  element_type *peVar1;
  semantics_t *__p_00;
  undefined1 local_60 [8];
  shared_ptr<tchecker::zg::semantics_t> semantics;
  undefined1 local_48 [8];
  shared_ptr<tchecker::zg::extrapolation_t> extrapolation;
  size_t table_size_local;
  size_t block_size_local;
  extrapolation_type_t extrapolation_type_local;
  semantics_type_t semantics_type_local;
  sharing_type_t sharing_type_local;
  shared_ptr<const_tchecker::ta::system_t> *system_local;
  
  extrapolation.super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)table_size;
  system_00 = std::
              __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)system);
  __p = extrapolation_factory(extrapolation_type,system_00);
  std::shared_ptr<tchecker::zg::extrapolation_t>::shared_ptr<tchecker::zg::extrapolation_t,void>
            ((shared_ptr<tchecker::zg::extrapolation_t> *)local_48,__p);
  peVar1 = std::__shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2> *)
                      local_48);
  if (peVar1 == (element_type *)0x0) {
    system_local = (shared_ptr<const_tchecker::ta::system_t> *)0x0;
    semantics.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 1;
  }
  else {
    __p_00 = semantics_factory(semantics_type);
    std::shared_ptr<tchecker::zg::semantics_t>::shared_ptr<tchecker::zg::semantics_t,void>
              ((shared_ptr<tchecker::zg::semantics_t> *)local_60,__p_00);
    system_local = (shared_ptr<const_tchecker::ta::system_t> *)operator_new(0x2e0);
    zg_t::zg_t((zg_t *)system_local,system,sharing_type,
               (shared_ptr<tchecker::zg::semantics_t> *)local_60,
               (shared_ptr<tchecker::zg::extrapolation_t> *)local_48,block_size,
               (size_t)extrapolation.
                       super___shared_ptr<tchecker::zg::extrapolation_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
    semantics.super___shared_ptr<tchecker::zg::semantics_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 1;
    std::shared_ptr<tchecker::zg::semantics_t>::~shared_ptr
              ((shared_ptr<tchecker::zg::semantics_t> *)local_60);
  }
  std::shared_ptr<tchecker::zg::extrapolation_t>::~shared_ptr
            ((shared_ptr<tchecker::zg::extrapolation_t> *)local_48);
  return (zg_t *)system_local;
}

Assistant:

tchecker::zg::zg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                             enum tchecker::ts::sharing_type_t sharing_type, enum tchecker::zg::semantics_type_t semantics_type,
                             enum tchecker::zg::extrapolation_type_t extrapolation_type, std::size_t block_size,
                             std::size_t table_size)
{
  std::shared_ptr<tchecker::zg::extrapolation_t> extrapolation{
      tchecker::zg::extrapolation_factory(extrapolation_type, *system)};
  if (extrapolation.get() == nullptr)
    return nullptr;
  std::shared_ptr<tchecker::zg::semantics_t> semantics{tchecker::zg::semantics_factory(semantics_type)};
  return new tchecker::zg::zg_t(system, sharing_type, semantics, extrapolation, block_size, table_size);
}